

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O1

void __thiscall
slang::TimeTrace::Profiler::begin
          (Profiler *this,string *name,
          function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          detail)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *in_FS_OFFSET;
  Entry local_80;
  
  if ((char)in_FS_OFFSET[-4] == '\0') {
    begin();
  }
  lVar3 = *in_FS_OFFSET;
  local_80.start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  paVar2 = &local_80.name.field_2;
  local_80.duration.__r = 0;
  local_80.threadId._M_thread = pthread_self();
  local_80.name._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p == paVar1) {
    local_80.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.name.field_2._8_4_ = *(undefined4 *)((long)&name->field_2 + 8);
    local_80.name.field_2._12_4_ = *(undefined4 *)((long)&name->field_2 + 0xc);
    local_80.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80.name._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (*detail.callback)(&local_80.detail,detail.callable);
  std::vector<slang::Entry,_std::allocator<slang::Entry>_>::emplace_back<slang::Entry>
            ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)(lVar3 + -0x38),&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.detail._M_dataplus._M_p != &local_80.detail.field_2) {
    operator_delete(local_80.detail._M_dataplus._M_p,
                    local_80.detail.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void begin(std::string name, function_ref<std::string()> detail) {
        stack.push_back(
            Entry{steady_clock::now(), {}, std::this_thread::get_id(), std::move(name), detail()});
    }